

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# td0.cpp
# Opt level: O0

uint LZSS::DecodeChar(void)

{
  uint uVar1;
  uint local_c;
  uint c;
  
  for (local_c = (uint)(short)son._1252_2_; local_c < 0x273;
      local_c = (uint)*(short *)(son + (ulong)(local_c + uVar1) * 2)) {
    uVar1 = GetBit();
  }
  UpdateTree(local_c - 0x273);
  return local_c - 0x273;
}

Assistant:

unsigned DecodeChar()
{
    unsigned c = son[R];

    // Travel from root to leaf, choosing the smaller child node (son[]) if the
    // read bit is 0, the bigger (son[]+1} if 1
    while (c < T)
        c = son[c + GetBit()];

    c -= T;
    UpdateTree(c);
    return c;
}